

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_gmatch_aux(lua_State *L)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint *puVar5;
  char *e_00;
  uint local_26c;
  int32_t pos;
  char *e;
  MatchState ms;
  char *src;
  TValue *tvpos;
  char *s;
  GCstr *str;
  char *p;
  lua_State *L_local;
  
  uVar1 = *(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x38);
  uVar3 = *(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30) & 0x7fffffffffff;
  pcVar4 = (char *)(uVar3 + 0x18);
  puVar5 = (uint *)((L->base[-2].u64 & 0x7fffffffffff) + 0x40);
  ms.capture[0x1f].len = (ptrdiff_t)(pcVar4 + *puVar5);
  ms.src_init = pcVar4 + *(uint *)(uVar3 + 0x14);
  e = pcVar4;
  ms.src_end = (char *)L;
  while( true ) {
    if (ms.src_init < (ulong)ms.capture[0x1f].len) {
      return 0;
    }
    ms.L._4_4_ = 0;
    ms.L._0_4_ = 0;
    e_00 = match((MatchState *)&e,(char *)ms.capture[0x1f].len,
                 (char *)((uVar1 & 0x7fffffffffff) + 0x18));
    if (e_00 != (char *)0x0) break;
    ms.capture[0x1f].len = ms.capture[0x1f].len + 1;
  }
  local_26c = (int)e_00 - (int)pcVar4;
  if (e_00 == (char *)ms.capture[0x1f].len) {
    local_26c = local_26c + 1;
  }
  *puVar5 = local_26c;
  iVar2 = push_captures((MatchState *)&e,(char *)ms.capture[0x1f].len,e_00);
  return iVar2;
}

Assistant:

LJLIB_NOREG LJLIB_CF(string_gmatch_aux)
{
  const char *p = strVdata(lj_lib_upvalue(L, 2));
  GCstr *str = strV(lj_lib_upvalue(L, 1));
  const char *s = strdata(str);
  TValue *tvpos = lj_lib_upvalue(L, 3);
  const char *src = s + tvpos->u32.lo;
  MatchState ms;
  ms.L = L;
  ms.src_init = s;
  ms.src_end = s + str->len;
  for (; src <= ms.src_end; src++) {
    const char *e;
    ms.level = ms.depth = 0;
    if ((e = match(&ms, src, p)) != NULL) {
      int32_t pos = (int32_t)(e - s);
      if (e == src) pos++;  /* Ensure progress for empty match. */
      tvpos->u32.lo = (uint32_t)pos;
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}